

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::Return(SQVM *this,SQInteger _arg0,SQInteger _arg1,SQObjectPtr *retval)

{
  int iVar1;
  SQBool SVar2;
  long lVar3;
  SQObjectPtr *local_48;
  SQObjectPtr *dest;
  SQInteger i;
  SQInteger callerbase;
  SQBool _isroot;
  SQObjectPtr *retval_local;
  SQInteger _arg1_local;
  SQInteger _arg0_local;
  SQVM *this_local;
  
  SVar2 = this->ci->_root;
  lVar3 = this->_stackbase;
  iVar1 = this->ci->_prevstkbase;
  if ((this->_debughook & 1U) != 0) {
    for (dest = (SQObjectPtr *)0x0; (long)dest < (long)this->ci->_ncalls;
        dest = (SQObjectPtr *)((long)&(dest->super_SQObject)._type + 1)) {
      CallDebugHook(this,0x72,0);
    }
  }
  local_48 = retval;
  if (SVar2 == 0) {
    if (this->ci->_target == -1) {
      local_48 = (SQObjectPtr *)0x0;
    }
    else {
      local_48 = (this->_stack)._vals + (lVar3 - iVar1) + (long)this->ci->_target;
    }
  }
  if (local_48 != (SQObjectPtr *)0x0) {
    if (_arg0 == 0xff) {
      ::SQObjectPtr::Null(local_48);
    }
    else {
      ::SQObjectPtr::operator=(local_48,(this->_stack)._vals + this->_stackbase + _arg1);
    }
  }
  LeaveFrame(this);
  return (bool)(-(SVar2 != 0) & 1);
}

Assistant:

bool SQVM::Return(SQInteger _arg0, SQInteger _arg1, SQObjectPtr &retval)
{
    SQBool    _isroot      = ci->_root;
    SQInteger callerbase   = _stackbase - ci->_prevstkbase;

    if (_debughook) {
        for(SQInteger i=0; i<ci->_ncalls; i++) {
            CallDebugHook(_SC('r'));
        }
    }

    SQObjectPtr *dest;
    if (_isroot) {
        dest = &(retval);
    } else if (ci->_target == -1) {
        dest = NULL;
    } else {
        dest = &_stack._vals[callerbase + ci->_target];
    }
    if (dest) {
        if(_arg0 != 0xFF) {
            *dest = _stack._vals[_stackbase+_arg1];
        }
        else {
            dest->Null();
        }
        //*dest = (_arg0 != 0xFF) ? _stack._vals[_stackbase+_arg1] : _null_;
    }
    LeaveFrame();
    return _isroot ? true : false;
}